

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O3

bool __thiscall
google::protobuf::compiler::Parser::ParseReservedNumbers
          (Parser *this,EnumDescriptorProto *message,LocationRecorder *parent_location)

{
  Rep *pRVar1;
  Tokenizer *pTVar2;
  Parser *this_00;
  RepeatedPtrFieldBase *this_01;
  bool bVar3;
  int iVar4;
  undefined8 in_RAX;
  EnumDescriptorProto_EnumReservedRange *obj;
  void *pvVar5;
  char *error;
  int iVar6;
  int end;
  int start;
  LocationRecorder start_location;
  Token start_token;
  LocationRecorder location;
  int local_c4;
  Parser *local_c0;
  uint local_b8;
  int local_b4;
  LocationRecorder local_b0;
  LocationRecorder *local_98;
  RepeatedPtrFieldBase *local_90;
  EnumDescriptorProto *local_88;
  undefined1 local_80 [8];
  _Alloc_hider local_78;
  size_type local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  undefined8 local_58;
  ColumnNumber local_50;
  LocationRecorder local_48;
  
  local_90 = &(message->reserved_range_).super_RepeatedPtrFieldBase;
  local_b8 = (uint)CONCAT71((int7)((ulong)in_RAX >> 8),1);
  local_c0 = this;
  local_98 = parent_location;
  local_88 = message;
  do {
    this_01 = local_90;
    LocationRecorder::LocationRecorder
              (&local_48,local_98,
               (message->reserved_range_).super_RepeatedPtrFieldBase.current_size_);
    pRVar1 = (message->reserved_range_).super_RepeatedPtrFieldBase.rep_;
    if (pRVar1 == (Rep *)0x0) {
LAB_0033fe99:
      obj = Arena::CreateMaybeMessage<google::protobuf::EnumDescriptorProto_EnumReservedRange>
                      (this_01->arena_);
      pvVar5 = internal::RepeatedPtrFieldBase::AddOutOfLineHelper(this_01,obj);
    }
    else {
      iVar6 = (message->reserved_range_).super_RepeatedPtrFieldBase.current_size_;
      if (pRVar1->allocated_size <= iVar6) goto LAB_0033fe99;
      (message->reserved_range_).super_RepeatedPtrFieldBase.current_size_ = iVar6 + 1;
      pvVar5 = pRVar1->elements[iVar6];
    }
    local_70 = 0;
    local_68._M_local_buf[0] = '\0';
    local_78._M_p = (pointer)&local_68;
    LocationRecorder::LocationRecorder(&local_b0,&local_48,1);
    this_00 = local_c0;
    pTVar2 = local_c0->input_;
    local_80._0_4_ = (pTVar2->current_).type;
    std::__cxx11::string::_M_assign((string *)&local_78);
    local_50 = (pTVar2->current_).end_column;
    local_58._0_4_ = (pTVar2->current_).line;
    local_58._4_4_ = (pTVar2->current_).column;
    error = "Expected enum number range.";
    if ((local_b8 & 1) != 0) {
      error = "Expected enum value or number range.";
    }
    bVar3 = ConsumeSignedInteger(this_00,&local_b4,error);
    LocationRecorder::~LocationRecorder(&local_b0);
    if (bVar3) {
      bVar3 = TryConsume(local_c0,"to");
      if (bVar3) {
        LocationRecorder::LocationRecorder(&local_b0,&local_48,2);
        bVar3 = TryConsume(local_c0,"max");
        if (bVar3) {
          local_c4 = 0x7fffffff;
        }
        else {
          bVar3 = ConsumeSignedInteger(local_c0,&local_c4,"Expected integer.");
          if (!bVar3) {
            LocationRecorder::~LocationRecorder(&local_b0);
            bVar3 = false;
            goto LAB_0034002a;
          }
        }
        iVar6 = local_c4;
        LocationRecorder::~LocationRecorder(&local_b0);
        iVar4 = local_b4;
      }
      else {
        LocationRecorder::LocationRecorder(&local_b0,&local_48,2);
        LocationRecorder::StartAt(&local_b0,(Token *)local_80);
        LocationRecorder::EndAt(&local_b0,(Token *)local_80);
        iVar6 = local_b4;
        local_c4 = local_b4;
        LocationRecorder::~LocationRecorder(&local_b0);
        iVar4 = iVar6;
      }
      *(int *)((long)pvVar5 + 0x18) = iVar4;
      *(byte *)((long)pvVar5 + 0x10) = *(byte *)((long)pvVar5 + 0x10) | 3;
      *(int *)((long)pvVar5 + 0x1c) = iVar6;
      bVar3 = true;
      local_b8 = 0;
    }
    else {
      bVar3 = false;
    }
LAB_0034002a:
    message = local_88;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_p != &local_68) {
      operator_delete(local_78._M_p);
    }
    LocationRecorder::~LocationRecorder(&local_48);
    if (!bVar3) {
      return false;
    }
    bVar3 = TryConsume(local_c0,",");
    if (!bVar3) {
      bVar3 = ConsumeEndOfDeclaration(local_c0,";",local_98);
      return bVar3;
    }
  } while( true );
}

Assistant:

bool Parser::ParseReservedNumbers(EnumDescriptorProto* message,
                                  const LocationRecorder& parent_location) {
  bool first = true;
  do {
    LocationRecorder location(parent_location, message->reserved_range_size());

    EnumDescriptorProto::EnumReservedRange* range =
        message->add_reserved_range();
    int start, end;
    io::Tokenizer::Token start_token;
    {
      LocationRecorder start_location(
          location, EnumDescriptorProto::EnumReservedRange::kStartFieldNumber);
      start_token = input_->current();
      DO(ConsumeSignedInteger(&start,
                              (first ? "Expected enum value or number range."
                                     : "Expected enum number range.")));
    }

    if (TryConsume("to")) {
      LocationRecorder end_location(
          location, EnumDescriptorProto::EnumReservedRange::kEndFieldNumber);
      if (TryConsume("max")) {
        // This is in the enum descriptor path, which doesn't have the message
        // set duality to fix up, so it doesn't integrate with the sentinel.
        end = INT_MAX;
      } else {
        DO(ConsumeSignedInteger(&end, "Expected integer."));
      }
    } else {
      LocationRecorder end_location(
          location, EnumDescriptorProto::EnumReservedRange::kEndFieldNumber);
      end_location.StartAt(start_token);
      end_location.EndAt(start_token);
      end = start;
    }

    range->set_start(start);
    range->set_end(end);
    first = false;
  } while (TryConsume(","));

  DO(ConsumeEndOfDeclaration(";", &parent_location));
  return true;
}